

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resbund.cpp
# Opt level: O0

ResourceBundle * __thiscall
icu_63::ResourceBundle::get
          (ResourceBundle *__return_storage_ptr__,ResourceBundle *this,int32_t indexR,
          UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_f0 [8];
  UResourceBundle r;
  UErrorCode *status_local;
  int32_t indexR_local;
  ResourceBundle *this_local;
  ResourceBundle *res;
  
  r._192_8_ = status;
  ures_initStackObject_63((UResourceBundle *)local_f0);
  ures_getByIndex_63(this->fResource,indexR,(UResourceBundle *)local_f0,(UErrorCode *)r._192_8_);
  ResourceBundle(__return_storage_ptr__,(UResourceBundle *)local_f0,(UErrorCode *)r._192_8_);
  UVar1 = ::U_SUCCESS(*(UErrorCode *)r._192_8_);
  if (UVar1 != '\0') {
    ures_close_63((UResourceBundle *)local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

ResourceBundle ResourceBundle::get(int32_t indexR, UErrorCode& status) const {
    UResourceBundle r;

    ures_initStackObject(&r);
    ures_getByIndex(fResource, indexR, &r, &status);
    ResourceBundle res(&r, status);
    if (U_SUCCESS(status)) {
        ures_close(&r);
    }
    return res;
}